

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalParse
          (SourceCodeInfo_Location *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  ArenaImpl *this_00;
  byte *pbVar3;
  string *psVar4;
  uint64 uVar5;
  Rep *pRVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  Arena *arena;
  RepeatedField<int> *object;
  ArenaStringPtr *this_01;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_bool> pVar12;
  byte *local_60;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  InternalMetadataWithArena *local_48;
  RepeatedField<int> *local_40;
  RepeatedField<int> *local_38;
  
  local_48 = &this->_internal_metadata_;
  local_50 = &this->trailing_comments_;
  local_58 = &this->leading_comments_;
  local_38 = &this->span_;
  local_40 = &this->path_;
  local_60 = (byte *)ptr;
LAB_0021fcd5:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= local_60) {
      if ((long)local_60 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)local_60;
      }
      pVar12 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,(char *)local_60,ctx->group_depth_);
      local_60 = (byte *)pVar12.first;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)local_60;
      }
    }
    bVar1 = *local_60;
    uVar9 = (ulong)bVar1;
    pbVar3 = local_60 + 1;
    if ((char)bVar1 < '\0') {
      uVar8 = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
      uVar9 = (ulong)uVar8;
      if (-1 < (char)*pbVar3) {
        pbVar3 = local_60 + 2;
        goto LAB_0021fd05;
      }
      pVar11 = internal::ReadTagFallback((char *)local_60,uVar8);
      local_60 = (byte *)pVar11.first;
      if (local_60 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    else {
LAB_0021fd05:
      pVar11._8_8_ = uVar9;
      pVar11.first = (char *)pbVar3;
      local_60 = pbVar3;
    }
    pbVar3 = (byte *)pVar11.first;
    uVar8 = pVar11.second;
    cVar7 = (char)pVar11.second;
    switch((uint)(pVar11._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      object = local_40;
      if (cVar7 == '\n') {
LAB_0021fd76:
        local_60 = (byte *)internal::PackedInt32Parser(object,(char *)pbVar3,ctx);
      }
      else {
        if ((uVar8 & 0xff) != 8) break;
        uVar5 = internal::ReadVarint((char **)&local_60);
        _internal_add_path(this,(int32)uVar5);
      }
      goto LAB_0021ff91;
    case 2:
      object = local_38;
      if (cVar7 == '\x12') goto LAB_0021fd76;
      if ((uVar8 & 0xff) == 0x10) {
        uVar5 = internal::ReadVarint((char **)&local_60);
        _internal_add_span(this,(int32)uVar5);
        goto LAB_0021ff91;
      }
      break;
    case 3:
      if (cVar7 != '\x1a') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      arena = (Arena *)(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = local_58->ptr_;
      this_01 = local_58;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
LAB_0021fdb8:
        internal::ArenaStringPtr::CreateInstance
                  (this_01,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar4 = this_01->ptr_;
        pbVar3 = local_60;
      }
LAB_0021fdcf:
      local_60 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)pbVar3,ctx);
      goto LAB_0021ff91;
    case 4:
      if (cVar7 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        psVar4 = local_50->ptr_;
        this_01 = local_50;
        if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0021fdb8;
        goto LAB_0021fdcf;
      }
      break;
    case 6:
      if (cVar7 == '2') {
        local_60 = pbVar3 + -1;
        do {
          local_60 = local_60 + 1;
          pRVar6 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar10 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_;
LAB_0021fe23:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar6 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar6->allocated_size;
LAB_0021fe33:
            pRVar6->allocated_size = iVar10 + 1;
            this_00 = (ArenaImpl *)
                      (this->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
            if (this_00 == (ArenaImpl *)0x0) {
              psVar4 = (string *)operator_new(0x20);
            }
            else {
              if (this_00[1].initial_block_ != (Block *)0x0) {
                Arena::OnArenaAllocation
                          ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              psVar4 = (string *)
                       internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                 (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>
                                 );
            }
            (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
            psVar4->_M_string_length = 0;
            (psVar4->field_2)._M_local_buf[0] = '\0';
            pRVar6 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
            (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1
            ;
            pRVar6->elements[iVar10] = psVar4;
          }
          else {
            iVar2 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar6->allocated_size;
            if (iVar10 <= iVar2) {
              if (iVar10 == (this->leading_detached_comments_).super_RepeatedPtrFieldBase.
                            total_size_) goto LAB_0021fe23;
              goto LAB_0021fe33;
            }
            (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar4 = (string *)pRVar6->elements[iVar2];
          }
          local_60 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)local_60,ctx);
          if (local_60 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_60 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_60 == 0x32));
        goto LAB_0021fcd5;
      }
    }
    if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
      return (char *)pbVar3;
    }
    local_60 = (byte *)internal::UnknownFieldParse(uVar8,local_48,(char *)pbVar3,ctx);
LAB_0021ff91:
    if (local_60 == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SourceCodeInfo_Location::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 span = 2 [packed = true];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_span(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16) {
          _internal_add_span(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string leading_comments = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_leading_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string trailing_comments = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_trailing_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.trailing_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string leading_detached_comments = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_leading_detached_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}